

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::PeerManagerImpl::FetchBlock_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PeerManagerImpl *this,NodeId peer_id,CBlockIndex *block_index)

{
  function<bool_(CNode_*)> func;
  bool bVar1;
  ulong extraout_RDX;
  Level level;
  long in_FS_OFFSET;
  string_view logging_function;
  optional<long> from_peer;
  string_view source_file;
  initializer_list<CInv> __l;
  PeerRef PVar2;
  allocator_type local_c1;
  vector<CInv,_std::allocator<CInv>_> invs;
  PeerRef peer;
  NodeId peer_id_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  CInv local_80;
  uint256 local_58;
  long local_38;
  NodeId id;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peer_id_local = peer_id;
  if (((*(byte *)(*(long *)(this + 0x118) + 0x9d0) & 1) == 0) &&
     ((*(byte *)(*(long *)(this + 0x118) + 0x9d1) & 1) != 0)) {
    PVar2 = anon_unknown.dwarf_1cfc8e::PeerManagerImpl::GetPeerRef
                      ((PeerManagerImpl *)&peer,(NodeId)this);
    if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[20]>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
                 "Peer does not exist",
                 PVar2.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
    else if ((((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_their_services)._M_i & NODE_WITNESS) == NODE_NONE) {
      std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[16]>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
                 "Pre-SegWit peer");
    }
    else {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock38,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                 ,0x7f9,false);
      CBlockIndex::GetBlockHash((uint256 *)&local_80,block_index);
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._8_8_ = 0;
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._M_payload._M_value = extraout_RDX;
      anon_unknown.dwarf_1cfc8e::PeerManagerImpl::RemoveBlockRequest
                ((PeerManagerImpl *)this,(uint256 *)&local_80,from_peer);
      id = peer_id_local;
      bVar1 = anon_unknown.dwarf_1cfc8e::PeerManagerImpl::BlockRequested
                        ((PeerManagerImpl *)this,peer_id_local,block_index,(iterator **)0x0);
      if (bVar1) {
        CBlockIndex::GetBlockHash(&local_58,block_index);
        CInv::CInv(&local_80,0x40000002,&local_58);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_80;
        std::vector<CInv,_std::allocator<CInv>_>::vector(&invs,__l,&local_c1);
        func.super__Function_base._M_functor._8_8_ = &invs;
        func.super__Function_base._M_functor._M_unused._M_function_pointer = (_func_void *)this;
        func.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2054:47)>
             ::_M_manager;
        func._M_invoker =
             std::
             _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2054:47)>
             ::_M_invoke;
        bVar1 = CConnman::ForNode(*(CConnman **)(this + 0x100),id,func);
        level = (Level)id;
        std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff18);
        if (bVar1) {
          bVar1 = ::LogAcceptCategory(NET,level);
          if (bVar1) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&local_80,(base_blob<256u> *)&local_58);
            logging_function._M_str = "FetchBlock";
            logging_function._M_len = 10;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file._M_len = 0x62;
            LogPrintFormatInternal<std::__cxx11::string,long>
                      (logging_function,source_file,0x80e,NET,Debug,
                       (ConstevalFormatString<2U>)0x689825,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_80,&peer_id_local);
            std::__cxx11::string::~string((string *)&local_80);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
        }
        else {
          std::_Optional_payload_base<std::__cxx11::string>::
          _Optional_payload_base<char_const(&)[25]>
                    ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
                     "Peer not fully connected");
        }
        std::_Vector_base<CInv,_std::allocator<CInv>_>::~_Vector_base
                  (&invs.super__Vector_base<CInv,_std::allocator<CInv>_>);
      }
      else {
        std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[33]>
                  ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
                   "Already requested from this peer");
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0019dc02:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0019dc02;
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[19]>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
               "Loading blocks ...");
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> PeerManagerImpl::FetchBlock(NodeId peer_id, const CBlockIndex& block_index)
{
    if (m_chainman.m_blockman.LoadingBlocks()) return "Loading blocks ...";

    // Ensure this peer exists and hasn't been disconnected
    PeerRef peer = GetPeerRef(peer_id);
    if (peer == nullptr) return "Peer does not exist";

    // Ignore pre-segwit peers
    if (!CanServeWitnesses(*peer)) return "Pre-SegWit peer";

    LOCK(cs_main);

    // Forget about all prior requests
    RemoveBlockRequest(block_index.GetBlockHash(), std::nullopt);

    // Mark block as in-flight
    if (!BlockRequested(peer_id, block_index)) return "Already requested from this peer";

    // Construct message to request the block
    const uint256& hash{block_index.GetBlockHash()};
    std::vector<CInv> invs{CInv(MSG_BLOCK | MSG_WITNESS_FLAG, hash)};

    // Send block request message to the peer
    bool success = m_connman.ForNode(peer_id, [this, &invs](CNode* node) {
        this->MakeAndPushMessage(*node, NetMsgType::GETDATA, invs);
        return true;
    });

    if (!success) return "Peer not fully connected";

    LogDebug(BCLog::NET, "Requesting block %s from peer=%d\n",
                 hash.ToString(), peer_id);
    return std::nullopt;
}